

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet_test.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::JsonnetTest_TestEvaluateSnippet_Test::
~JsonnetTest_TestEvaluateSnippet_Test(JsonnetTest_TestEvaluateSnippet_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonnetTest, TestEvaluateSnippet)
{
    const char* snippet = "std.assertEqual(({ x: 1, y: self.x } { x: 2 }).y, 2)";
    struct JsonnetVm* vm = jsonnet_make();
    ASSERT_FALSE(vm == nullptr);
    int error = 0;
    char* output = jsonnet_evaluate_snippet(vm, "snippet", snippet, &error);
    EXPECT_EQ(0, error);
    jsonnet_realloc(vm, output, 0);
    jsonnet_destroy(vm);
}